

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_tree_renderer.cpp
# Opt level: O2

string * __thiscall
duckdb::TextTreeRenderer::ExtraInfoSeparator_abi_cxx11_
          (string *__return_storage_ptr__,TextTreeRenderer *this)

{
  allocator local_39;
  string local_38;
  
  ::std::__cxx11::string::string((string *)&local_38,(this->config).HORIZONTAL,&local_39);
  StringUtil::Repeat((string *)__return_storage_ptr__,&local_38,(this->config).node_render_width - 9
                    );
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string TextTreeRenderer::ExtraInfoSeparator() {
	return StringUtil::Repeat(string(config.HORIZONTAL), (config.node_render_width - 9));
}